

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoopBreakLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loopbreak(NeuralNetworkLayer *this)

{
  bool bVar1;
  LoopBreakLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_loopbreak(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loopbreak(this);
    this_00 = (LoopBreakLayerParams *)operator_new(0x18);
    LoopBreakLayerParams::LoopBreakLayerParams(this_00);
    (this->layer_).loopbreak_ = this_00;
  }
  return (LoopBreakLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopBreakLayerParams* NeuralNetworkLayer::mutable_loopbreak() {
  if (!has_loopbreak()) {
    clear_layer();
    set_has_loopbreak();
    layer_.loopbreak_ = new ::CoreML::Specification::LoopBreakLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loopBreak)
  return layer_.loopbreak_;
}